

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::DeadStoreImplicitCallBailOut
          (BackwardPass *this,Instr *instr,bool hasLiveFields,bool needsLazyBailOut)

{
  code *pcVar1;
  Instr *this_00;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  bool needsBailOutOnImplicitCall;
  BailOutKind kind_1;
  BailOutKind BStack_20;
  bool mayNeedBailOnImplicitCall;
  BailOutKind kindNoBits;
  BailOutKind kind;
  bool needsLazyBailOut_local;
  bool hasLiveFields_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  kindNoBits._2_1_ = needsLazyBailOut;
  kindNoBits._3_1_ = hasLiveFields;
  _kind = instr;
  instr_local = (Instr *)this;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x960,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsPrePass(this);
  if (((!bVar2) && (bVar2 = IR::Instr::HasBailOutInfo(_kind), bVar2)) &&
     (bVar2 = OpCodeAttr::BailOutRec(_kind->m_opcode), !bVar2)) {
    UpdateArrayBailOutKind(this,_kind);
    BVar3 = IR::Instr::GetBailOutKind(_kind);
    BVar3 = IR::operator&(BVar3,BailOutMarkTempObject);
    if ((BVar3 != BailOutInvalid) &&
       (BVar3 = IR::Instr::GetBailOutKindNoBits(_kind), BVar3 != BailOutOnImplicitCallsPreOp)) {
      BStack_20 = IR::Instr::GetBailOutKind(_kind);
      BVar3 = IR::Instr::GetBailOutKindNoBits(_kind);
      if (BVar3 == BailOutOnImplicitCalls) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x975,"(kindNoBits != IR::BailOutOnImplicitCalls)",
                           "kindNoBits != IR::BailOutOnImplicitCalls");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      BVar4 = BStack_20;
      if (BVar3 == BailOutInvalid) {
        BVar3 = IR::operator~(BailOutForArrayBits);
        BVar3 = IR::operator&(BVar4,BVar3);
        BVar3 = BailOutInfo::WithoutLazyBailOut(BVar3);
        if (BVar3 != BailOutMarkTempObject) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x979,
                             "(BailOutInfo::WithoutLazyBailOut(kind & ~IR::BailOutForArrayBits) == IR::BailOutMarkTempObject)"
                             ,
                             "BailOutInfo::WithoutLazyBailOut(kind & ~IR::BailOutForArrayBits) == IR::BailOutMarkTempObject"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        BVar3 = IR::operator&(BStack_20,BailOutOnArrayAccessHelperCall);
        if ((BVar3 == BailOutInvalid) &&
           (bVar2 = BasicBlock::IsLandingPad(this->currentBlock), !bVar2)) {
          IR::operator+=(&stack0xffffffffffffffe0,5);
          IR::Instr::SetBailOutKind(_kind,BStack_20);
        }
      }
    }
    BVar3 = IR::Instr::GetBailOutKind(_kind);
    bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
    if (bVar2) {
      bVar2 = IsImplicitCallBailOutCurrentlyNeeded
                        (this,_kind,bVar2,
                         (bool)(kindNoBits._2_1_ & BailOutConvertedNativeArray >> 0x10),
                         (bool)(kindNoBits._3_1_ & BailOutLocalValueChanged >> 0x18));
      bVar2 = UpdateImplicitCallBailOutKind
                        (_kind,bVar2,(bool)(kindNoBits._2_1_ & BailOutConvertedNativeArray >> 0x10))
      ;
      if (!bVar2) {
        IR::Instr::ClearBailOutInfo(_kind);
        if (this->preOpBailOutInstrToProcess == _kind) {
          this->preOpBailOutInstrToProcess = (Instr *)0x0;
        }
        bVar2 = DoMarkTempObjectVerify(this);
        if (bVar2) {
          ObjectTempVerify::NotifyBailOutRemoval
                    (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,_kind,this
                    );
        }
      }
    }
    else {
      BVar3 = IR::Instr::GetBailOutKind(_kind);
      BVar4 = IR::operator&(BVar3,BailOutMarkTempObject);
      this_00 = _kind;
      if (BVar4 != BailOutInvalid) {
        if (BVar3 == BailOutMarkTempObject) {
          bVar2 = BasicBlock::IsLandingPad(this->currentBlock);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x98f,"(this->currentBlock->IsLandingPad())",
                               "this->currentBlock->IsLandingPad()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          IR::Instr::ClearBailOutInfo(_kind);
          if (this->preOpBailOutInstrToProcess == _kind) {
            this->preOpBailOutInstrToProcess = (Instr *)0x0;
          }
        }
        else {
          BVar4 = IR::operator~(BailOutMarkTempObject);
          BVar3 = IR::operator&(BVar3,BVar4);
          IR::Instr::SetBailOutKind(this_00,BVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::DeadStoreImplicitCallBailOut(IR::Instr * instr, bool hasLiveFields, bool needsLazyBailOut)
{
    Assert(this->tag == Js::DeadStorePhase);

    if (this->IsPrePass() || !instr->HasBailOutInfo())
    {
        // Don't do this in the pre-pass, because, for instance, we don't have live-on-back-edge fields yet.
        return;
    }

    if (OpCodeAttr::BailOutRec(instr->m_opcode))
    {
        // This is something like OpCode::BailOutOnNotEqual. Assume it needs what it's got.
        return;
    }

    UpdateArrayBailOutKind(instr);

    // Install the implicit call PreOp for mark temp object if we need one.
    if ((instr->GetBailOutKind() & IR::BailOutMarkTempObject) != 0 && instr->GetBailOutKindNoBits() != IR::BailOutOnImplicitCallsPreOp)
    {
        IR::BailOutKind kind = instr->GetBailOutKind();
        const IR::BailOutKind kindNoBits = instr->GetBailOutKindNoBits();
        Assert(kindNoBits != IR::BailOutOnImplicitCalls);
        if (kindNoBits == IR::BailOutInvalid)
        {
            // We should only have combined with array bits or lazy bailout
            Assert(BailOutInfo::WithoutLazyBailOut(kind & ~IR::BailOutForArrayBits) == IR::BailOutMarkTempObject);
            // Don't need to install if we are not going to do helper calls,
            // or we are in the landingPad since implicit calls are already turned off.
            if ((kind & IR::BailOutOnArrayAccessHelperCall) == 0 && !this->currentBlock->IsLandingPad())
            {
                kind += IR::BailOutOnImplicitCallsPreOp;
                instr->SetBailOutKind(kind);
            }
        }
    }

    // Currently only try to eliminate these bailout kinds. The others are required in cases
    // where we don't necessarily have live/hoisted fields.
    const bool mayNeedBailOnImplicitCall = BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind());
    if (!mayNeedBailOnImplicitCall)
    {
        const IR::BailOutKind kind = instr->GetBailOutKind();
        if (kind & IR::BailOutMarkTempObject)
        {
            if (kind == IR::BailOutMarkTempObject)
            {
                // Landing pad does not need per-instr implicit call bailouts.
                Assert(this->currentBlock->IsLandingPad());
                instr->ClearBailOutInfo();
                if (this->preOpBailOutInstrToProcess == instr)
                {
                    this->preOpBailOutInstrToProcess = nullptr;
                }
            }
            else
            {
                // Mark temp object bit is not needed after dead store pass
                instr->SetBailOutKind(kind & ~IR::BailOutMarkTempObject);
            }
        }
        return;
    }

    // We have an implicit call bailout in the code, and we want to make sure that it's required.
    // Do this now, because only in the dead store pass do we have complete forward and backward liveness info.
    bool needsBailOutOnImplicitCall = this->IsImplicitCallBailOutCurrentlyNeeded(instr, mayNeedBailOnImplicitCall, needsLazyBailOut, hasLiveFields);
    if(!UpdateImplicitCallBailOutKind(instr, needsBailOutOnImplicitCall, needsLazyBailOut))
    {
        instr->ClearBailOutInfo();
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
#if DBG
        if (this->DoMarkTempObjectVerify())
        {
            this->currentBlock->tempObjectVerifyTracker->NotifyBailOutRemoval(instr, this);
        }
#endif
    }
}